

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

byte * Js::ByteCodeBufferReader::ReadInt16(byte *buffer,size_t remainingBytes,int16 *value)

{
  byte *pbVar1;
  int16 *value_local;
  size_t remainingBytes_local;
  byte *buffer_local;
  
  pbVar1 = ReadVariableInt<short>(buffer,remainingBytes,value);
  return pbVar1;
}

Assistant:

static const byte * ReadInt16(const byte * buffer, size_t remainingBytes, int16 * value)
    {
#if VARIABLE_INT_ENCODING
        return ReadVariableInt<int16>(buffer, remainingBytes, value);
#else
        Assert(remainingBytes>=sizeof(int16));
        *value = *(int16 *) buffer;
        return buffer + sizeof(int16);
#endif
    }